

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O2

void add_verify::AddVerify(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Verifying Addition:");
  std::endl<char,std::char_traits<char>>(poVar1);
  AddVerifyBase<unsigned_long,unsigned_int>("uint64_uint32");
  AddVerifyBase<unsigned_long,unsigned_short>("uint64_uint16");
  AddVerifyBase<unsigned_long,unsigned_char>("uint64_uint8");
  AddVerifyBase<unsigned_long,int>("uint64_int32");
  AddVerifyBase<unsigned_long,short>("uint64_int16");
  AddVerifyBase<unsigned_long,signed_char>("uint64_int8");
  AddVerifyBase<long,unsigned_int>("int64_uint32");
  AddVerifyBase<long,unsigned_short>("int64_uint16");
  AddVerifyBase<long,unsigned_short>("int64_uint8");
  AddVerifyBase<long,int>("int64_int32");
  AddVerifyBase<long,short>("int64_int16");
  AddVerifyBase<long,signed_char>("int64_int8");
  AddVerifyBase<unsigned_int,unsigned_int>("uint32_uint32");
  AddVerifyBase<unsigned_int,int>("uint32_int32");
  AddVerifyBase<int,unsigned_int>("int32_uint32");
  AddVerifyBase<int,int>("int32_int32");
  AddVerifyBase<unsigned_char,unsigned_int>("uint8_t_uint32");
  AddVerifyBase<unsigned_char,int>("uint8_t_int32");
  AddVerifyBase<signed_char,unsigned_int>("int8_t_uint32");
  AddVerifyBase<signed_char,int>("int8_t_int32");
  return;
}

Assistant:

void AddVerify()
{
    std::cout << "Verifying Addition:" << std::endl;

    // Unsigned int64, unsigned cases
	AddVerifyBase<std::uint64_t, std::uint64_t>("uint64_uint64");
	AddVerifyBase<std::uint64_t, std::uint32_t>("uint64_uint32");
	AddVerifyBase<std::uint64_t, std::uint16_t>("uint64_uint16");
	AddVerifyBase<std::uint64_t, std::uint8_t>("uint64_uint8");

    // Unsigned int64, signed cases
	AddVerifyBase<std::uint64_t, std::int64_t>("uint64_int64");
	AddVerifyBase<std::uint64_t, std::int32_t>("uint64_int32");
	AddVerifyBase<std::uint64_t, std::int16_t>("uint64_int16");
	AddVerifyBase<std::uint64_t, std::int8_t>("uint64_int8");

	// Signed int64, unsigned cases
	AddVerifyBase<std::int64_t, std::uint64_t>("int64_uint64");
	AddVerifyBase<std::int64_t, std::uint32_t>("int64_uint32");
	AddVerifyBase<std::int64_t, std::uint16_t>("int64_uint16");
	AddVerifyBase<std::int64_t, std::uint16_t>("int64_uint8");

    // Signed int64, signed cases
	AddVerifyBase<std::int64_t, std::int64_t>("int64_int64");
	AddVerifyBase<std::int64_t, std::int32_t>("int64_int32");
	AddVerifyBase<std::int64_t, std::int16_t>("int64_int16");
	AddVerifyBase<std::int64_t, std::int8_t>("int64_int8");

	// Unsigned int32, unsigned cases
	AddVerifyBase<std::uint32_t, std::uint64_t>("uint32_uint64");
	AddVerifyBase<std::uint32_t, std::uint32_t>("uint32_uint32");
	// TBD - 16, 8-bit

	// Unsigned int32, signed cases
	AddVerifyBase<std::uint32_t, std::int64_t>("uint32_int64");
	AddVerifyBase<std::uint32_t, std::int32_t>("uint32_int32");
	// TBD - 16, 8-bit

	// Signed int32, unsigned cases
	AddVerifyBase<std::int32_t, std::uint64_t>("int32_uint64");
	AddVerifyBase<std::int32_t, std::uint32_t>("int32_uint32");
	// TBD - 16, 8-bit

	// Signed int32, signed cases
	AddVerifyBase<std::int32_t, std::int64_t>("int32_int64");
	AddVerifyBase<std::int32_t, std::int32_t>("int32_int32");
	// TBD - 16, 8-bit

	// Unsigned int8, unsigned cases
	AddVerifyBase<std::uint8_t, std::uint64_t>("uint8_t_uint64");
	AddVerifyBase<std::uint8_t, std::uint32_t>("uint8_t_uint32");
	AddVerifyBase<std::uint8_t, std::uint16_t>("uint8_t_uint16");
	AddVerifyBase<std::uint8_t, std::uint8_t>("uint8_t_uint8");

    // Unsigned int8, signed cases
	AddVerifyBase<std::uint8_t, std::int64_t>("uint8_t_int64");
	AddVerifyBase<std::uint8_t, std::int32_t>("uint8_t_int32");
	AddVerifyBase<std::uint8_t, std::int16_t>("uint8_t_int16");
	AddVerifyBase<std::uint8_t, std::int8_t>("uint8_t_int8");

	// Signed int8, unsigned cases
	AddVerifyBase<std::int8_t, std::uint64_t>("int8_t_uint64");
	AddVerifyBase<std::int8_t, std::uint32_t>("int8_t_uint32");
	AddVerifyBase<std::int8_t, std::uint16_t>("int8_t_uint16");
	AddVerifyBase<std::int8_t, std::uint8_t>("int8_t_uint8");

    // Signed int8, signed cases
	AddVerifyBase<std::int8_t, std::int64_t>("int8_t_int64");
	AddVerifyBase<std::int8_t, std::int32_t>("int8_t_int32");
	AddVerifyBase<std::int8_t, std::int16_t>("int8_t_int16");
	AddVerifyBase<std::int8_t, std::int8_t>("int8_t_int8");
}